

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask31_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x1f | uVar1;
  uVar2 = uVar2 >> 1;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0x1e | uVar2;
  uVar1 = uVar1 >> 2;
  out[2] = uVar1;
  uVar2 = in[3];
  out[2] = uVar2 << 0x1d | uVar1;
  uVar2 = uVar2 >> 3;
  out[3] = uVar2;
  uVar1 = in[4];
  out[3] = uVar1 << 0x1c | uVar2;
  uVar1 = uVar1 >> 4;
  out[4] = uVar1;
  uVar2 = in[5];
  out[4] = uVar2 << 0x1b | uVar1;
  uVar2 = uVar2 >> 5;
  out[5] = uVar2;
  uVar1 = in[6];
  out[5] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[6] = uVar1;
  uVar2 = in[7];
  out[6] = uVar2 << 0x19 | uVar1;
  uVar2 = uVar2 >> 7;
  out[7] = uVar2;
  uVar1 = in[8];
  out[7] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[8] = uVar1;
  uVar2 = in[9];
  out[8] = uVar2 << 0x17 | uVar1;
  uVar2 = uVar2 >> 9;
  out[9] = uVar2;
  uVar1 = in[10];
  out[9] = uVar1 << 0x16 | uVar2;
  uVar1 = uVar1 >> 10;
  out[10] = uVar1;
  uVar2 = in[0xb];
  out[10] = uVar2 << 0x15 | uVar1;
  uVar2 = uVar2 >> 0xb;
  out[0xb] = uVar2;
  uVar1 = in[0xc];
  out[0xb] = uVar1 << 0x14 | uVar2;
  uVar1 = uVar1 >> 0xc;
  out[0xc] = uVar1;
  uVar2 = in[0xd];
  out[0xc] = uVar2 << 0x13 | uVar1;
  uVar2 = uVar2 >> 0xd;
  out[0xd] = uVar2;
  uVar1 = in[0xe];
  out[0xd] = uVar1 << 0x12 | uVar2;
  uVar1 = uVar1 >> 0xe;
  out[0xe] = uVar1;
  uVar2 = in[0xf];
  out[0xe] = uVar2 << 0x11 | uVar1;
  uVar2 = uVar2 >> 0xf;
  out[0xf] = uVar2;
  uVar1 = in[0x10];
  out[0xf] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[0x10] = uVar1;
  uVar2 = in[0x11];
  out[0x10] = uVar2 << 0xf | uVar1;
  uVar2 = uVar2 >> 0x11;
  out[0x11] = uVar2;
  uVar1 = in[0x12];
  out[0x11] = uVar1 << 0xe | uVar2;
  uVar1 = uVar1 >> 0x12;
  out[0x12] = uVar1;
  uVar2 = in[0x13];
  out[0x12] = uVar2 << 0xd | uVar1;
  uVar2 = uVar2 >> 0x13;
  out[0x13] = uVar2;
  uVar1 = in[0x14];
  out[0x13] = uVar1 << 0xc | uVar2;
  uVar1 = uVar1 >> 0x14;
  out[0x14] = uVar1;
  uVar2 = in[0x15];
  out[0x14] = uVar2 << 0xb | uVar1;
  uVar2 = uVar2 >> 0x15;
  out[0x15] = uVar2;
  uVar1 = in[0x16];
  out[0x15] = uVar1 << 10 | uVar2;
  uVar1 = uVar1 >> 0x16;
  out[0x16] = uVar1;
  uVar2 = in[0x17];
  out[0x16] = uVar2 << 9 | uVar1;
  out[0x17] = uVar2 >> 0x17;
  return out + 0x18;
}

Assistant:

uint32_t *__fastpackwithoutmask31_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (31 - 30);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (31 - 29);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (31 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (31 - 27);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (31 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (31 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (31 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (31 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (31 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (31 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (31 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (31 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (31 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (31 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (31 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (31 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (31 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (31 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  *out = ((*in)) >> (31 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (31 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (31 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (31 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++out;
  *out = ((*in)) >> (31 - 8);
  ++in;

  return out + 1;
}